

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_object.cxx
# Opt level: O2

bool __thiscall xray_re::xr_object::load_object(xr_object *this,char *path)

{
  xr_file_system *this_00;
  xr_reader *this_01;
  bool bVar1;
  xr_reader *s;
  xr_reader *local_28;
  
  this_00 = xr_file_system::instance();
  this_01 = xr_file_system::r_open(this_00,path);
  if (this_01 == (xr_reader *)0x0) {
    bVar1 = false;
  }
  else {
    local_28 = xr_reader::open_chunk(this_01,0x7777);
    bVar1 = local_28 != (xr_reader *)0x0;
    if (bVar1) {
      (*(this->super_xr_surface_factory)._vptr_xr_surface_factory[8])(this,local_28);
      xr_reader::close_chunk(this_01,&local_28);
    }
    (*this_01->_vptr_xr_reader[1])(this_01);
  }
  return bVar1;
}

Assistant:

bool xr_object::load_object(const char* path)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(path);
	if (r == 0)
		return false;
	bool status = false;
	xr_reader* s = r->open_chunk(EOBJ_CHUNK_MAIN);
	if (s) {
		try {
			load_object(*s);
			status = true;
		} catch (xr_error) {
			clear();
		}
		r->close_chunk(s);
	}
	fs.r_close(r);
	return status;
}